

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O3

int __thiscall
chrono::ChSystemDescriptor::FromVariablesToVector
          (ChSystemDescriptor *this,ChVectorDynamic<> *mvector,bool resize_vector)

{
  double *pdVar1;
  double *pdVar2;
  uint uVar3;
  ChVariables *pCVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  int iVar13;
  uint uVar14;
  Index size;
  ulong uVar15;
  undefined7 in_register_00000011;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  ChVectorRef local_48;
  
  if ((int)CONCAT71(in_register_00000011,resize_vector) != 0) {
    iVar13 = (*this->_vptr_ChSystemDescriptor[7])(this);
    this->n_q = iVar13;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&mvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)iVar13
              );
    lVar20 = (mvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
    if (lVar20 < 0) {
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    if (lVar20 != 0) {
      memset((mvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data,0,lVar20 << 3);
    }
  }
  lVar20 = (long)(this->vvariables).
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->vvariables).
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  if (lVar20 != 0) {
    lVar20 = lVar20 >> 3;
    lVar21 = 0;
    do {
      pCVar4 = (this->vvariables).
               super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar21];
      if (pCVar4->disabled == false) {
        ChVariables::Get_qb(&local_48,pCVar4);
        pCVar4 = (this->vvariables).
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar21];
        uVar3 = pCVar4->offset;
        uVar14 = (*pCVar4->_vptr_ChVariables[2])();
        pdVar5 = (mvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                 .m_data;
        if ((int)uVar14 < 0 && pdVar5 != (double *)0x0) {
          __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                        ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                        "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
                       );
        }
        uVar15 = (ulong)(int)uVar14;
        if (((int)(uVar14 | uVar3) < 0) ||
           ((long)((mvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_rows - uVar15) < (long)(int)uVar3)) {
          __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                        ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                        "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                       );
        }
        if (local_48.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._8_8_ != uVar15) {
          __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                        ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                        "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>]"
                       );
        }
        pdVar5 = pdVar5 + (int)uVar3;
        uVar16 = uVar15;
        if ((((ulong)pdVar5 & 7) == 0) &&
           (uVar16 = (ulong)(-((uint)((ulong)pdVar5 >> 3) & 0x1fffffff) & 7),
           (long)uVar15 <= (long)uVar16)) {
          uVar16 = uVar15;
        }
        uVar18 = uVar15 - uVar16;
        uVar17 = uVar18 + 7;
        if (-1 < (long)uVar18) {
          uVar17 = uVar18;
        }
        if (0 < (long)uVar16) {
          uVar19 = 0;
          do {
            pdVar5[uVar19] =
                 *(double *)
                  (local_48.
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   ._0_8_ + uVar19 * 8);
            uVar19 = uVar19 + 1;
          } while (uVar16 != uVar19);
        }
        uVar17 = (uVar17 & 0xfffffffffffffff8) + uVar16;
        if (7 < (long)uVar18) {
          do {
            pdVar1 = (double *)
                     (local_48.
                      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                      ._0_8_ + uVar16 * 8);
            dVar6 = pdVar1[1];
            dVar7 = pdVar1[2];
            dVar8 = pdVar1[3];
            dVar9 = pdVar1[4];
            dVar10 = pdVar1[5];
            dVar11 = pdVar1[6];
            dVar12 = pdVar1[7];
            pdVar2 = pdVar5 + uVar16;
            *pdVar2 = *pdVar1;
            pdVar2[1] = dVar6;
            pdVar2[2] = dVar7;
            pdVar2[3] = dVar8;
            pdVar2[4] = dVar9;
            pdVar2[5] = dVar10;
            pdVar2[6] = dVar11;
            pdVar2[7] = dVar12;
            uVar16 = uVar16 + 8;
          } while ((long)uVar16 < (long)uVar17);
        }
        if ((long)uVar17 < (long)uVar15) {
          do {
            pdVar5[uVar17] =
                 *(double *)
                  (local_48.
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   ._0_8_ + uVar17 * 8);
            uVar17 = uVar17 + 1;
          } while (uVar15 != uVar17);
        }
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 != lVar20 + (ulong)(lVar20 == 0));
  }
  return this->n_q;
}

Assistant:

int ChSystemDescriptor::FromVariablesToVector(ChVectorDynamic<>& mvector, bool resize_vector) {
    // Count active variables and resize vector if necessary
    if (resize_vector) {
        n_q = CountActiveVariables();
        mvector.setZero(n_q);
    }

    // Fill the vector
    auto vv_size = vvariables.size();
    for (size_t iv = 0; iv < vv_size; iv++) {
        if (vvariables[iv]->IsActive()) {
            mvector.segment(vvariables[iv]->GetOffset(), vvariables[iv]->Get_ndof()) = vvariables[iv]->Get_qb();
        }
    }

    return n_q;
}